

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_visitor.cpp
# Opt level: O0

void __thiscall interpreter_visitor::visit(interpreter_visitor *this,OrExpr *ptr)

{
  int iVar1;
  bool local_1d;
  int first;
  OrExpr *ptr_local;
  interpreter_visitor *this_local;
  
  (**(ptr->first->super_Base)._vptr_Base)();
  iVar1 = this->result;
  (**(ptr->second->super_Base)._vptr_Base)();
  local_1d = true;
  if (iVar1 == 0) {
    local_1d = this->result != 0;
  }
  this->result = (uint)local_1d;
  return;
}

Assistant:

void interpreter_visitor::visit(OrExpr* ptr) {

    ptr->first->accept(this);
    auto first = result;
    ptr->second->accept(this);
    result = (first || result);
}